

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * extraBddCheckVarsSymmetric(DdManager *dd,DdNode *bF,DdNode *bVars)

{
  bool bVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdHalfWord local_78;
  DdHalfWord local_74;
  DdHalfWord local_70;
  int iLev2;
  int iLev1;
  int fVar1Pres;
  DdNode *bVarsR;
  int LevelF;
  DdNode *bFR;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bRes;
  DdNode *bVars_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  if (bF == (DdNode *)((ulong)dd->one ^ 1)) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    if (bVars == dd->one) {
      __assert_fail("bVars != b1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                    ,0x49b,"DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)");
    }
    dd_local = (DdManager *)cuddCacheLookup2(dd,extraBddCheckVarsSymmetric,bF,bVars);
    if (dd_local == (DdManager *)0x0) {
      pDVar2 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
      if (pDVar2->index == 0x7fffffff) {
        local_78 = pDVar2->index;
      }
      else {
        local_78 = dd->perm[pDVar2->index];
      }
      pDVar3 = (DdNode *)((ulong)bVars & 0xfffffffffffffffe);
      if (pDVar3 == bVars) {
        bVar1 = false;
        if ((bVars->type).kids.T == dd->one) {
          local_70 = 0xffffffff;
          local_74 = dd->perm[bVars->index];
        }
        else {
          if ((((bVars->type).kids.T)->type).kids.T != dd->one) {
            __assert_fail("cuddT(cuddT(bVars)) == b1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                          ,0x4bc,
                          "DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)");
          }
          local_70 = dd->perm[bVars->index];
          local_74 = dd->perm[((bVars->type).kids.T)->index];
        }
      }
      else {
        if ((pDVar3->type).kids.T != dd->one) {
          __assert_fail("cuddT(bVarsR) == b1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                        ,0x4ad,"DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)"
                       );
        }
        bVar1 = true;
        local_70 = 0xffffffff;
        local_74 = dd->perm[pDVar3->index];
      }
      if ((int)local_78 < (int)local_74) {
        if (pDVar2 == bF) {
          bF1 = (pDVar2->type).kids.E;
          bFR = (pDVar2->type).kids.T;
        }
        else {
          bF1 = (DdNode *)((ulong)(pDVar2->type).kids.E ^ 1);
          bFR = (DdNode *)((ulong)(pDVar2->type).kids.T ^ 1);
        }
      }
      else {
        bFR = (DdNode *)0x0;
        bF1 = (DdNode *)0x0;
      }
      if ((int)local_78 < (int)local_70) {
        pDVar2 = extraBddCheckVarsSymmetric(dd,bF1,bVars);
        if (pDVar2 == dd->zero) {
          __assert_fail("bRes0 != z0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                        ,0x4e3,"DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)"
                       );
        }
        if (pDVar2 == (DdNode *)((ulong)dd->one ^ 1)) {
          bRes0 = (DdNode *)((ulong)dd->one ^ 1);
        }
        else {
          bRes0 = extraBddCheckVarsSymmetric(dd,bFR,bVars);
        }
        if (bRes0 == dd->zero) {
          __assert_fail("bRes != z0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                        ,0x4e9,"DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)"
                       );
        }
      }
      else if (local_78 == local_70) {
        pDVar2 = extraBddCheckVarsSymmetric(dd,bF1,(DdNode *)((ulong)(bVars->type).kids.T ^ 1));
        if (pDVar2 == (DdNode *)((ulong)dd->one ^ 1)) {
          bRes0 = (DdNode *)((ulong)dd->one ^ 1);
        }
        else {
          pDVar3 = extraBddCheckVarsSymmetric(dd,bFR,(DdNode *)((ulong)(bVars->type).kids.T ^ 1));
          if (pDVar3 == (DdNode *)((ulong)dd->one ^ 1)) {
            bRes0 = (DdNode *)((ulong)dd->one ^ 1);
          }
          else if ((pDVar2 == dd->zero) || (pDVar3 == dd->zero)) {
            bRes0 = dd->one;
          }
          else {
            bRes0 = (DdNode *)((ulong)dd->one ^ 1);
          }
        }
      }
      else if ((int)local_78 < (int)local_74) {
        pDVar2 = extraBddCheckVarsSymmetric(dd,bF1,bVars);
        if (pDVar2 == (DdNode *)((ulong)dd->one ^ 1)) {
          bRes0 = (DdNode *)((ulong)dd->one ^ 1);
        }
        else {
          pDVar3 = extraBddCheckVarsSymmetric(dd,bFR,bVars);
          if (pDVar3 == (DdNode *)((ulong)dd->one ^ 1)) {
            bRes0 = (DdNode *)((ulong)dd->one ^ 1);
          }
          else if ((pDVar2 == dd->zero) || (pDVar3 == dd->zero)) {
            bRes0 = dd->zero;
          }
          else {
            bRes0 = dd->one;
          }
        }
      }
      else if (local_78 == local_74) {
        if (bVar1) {
          bRes0 = dd->zero;
        }
        else {
          bRes0 = (DdNode *)((ulong)dd->one ^ 1);
        }
      }
      else {
        bRes0 = dd->one;
      }
      cuddCacheInsert2(dd,extraBddCheckVarsSymmetric,bF,bVars,bRes0);
      dd_local = (DdManager *)bRes0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraBddCheckVarsSymmetric( 
  DdManager * dd,    /* the DD manager */
  DdNode * bF,
  DdNode * bVars) 
{
    DdNode * bRes;

    if ( bF == b0 )
        return b1;

    assert( bVars != b1 );
    
    if ( (bRes = cuddCacheLookup2(dd, extraBddCheckVarsSymmetric, bF, bVars)) )
        return bRes;
    else
    {
        DdNode * bRes0, * bRes1;
        DdNode * bF0, * bF1;             
        DdNode * bFR = Cudd_Regular(bF);
        int LevelF = cuddI(dd,bFR->index);

        DdNode * bVarsR = Cudd_Regular(bVars);
        int fVar1Pres;
        int iLev1;
        int iLev2;

        if ( bVarsR != bVars ) // cube's pointer is complemented
        {
            assert( cuddT(bVarsR) == b1 );
            fVar1Pres = 1;                    // the first var is present on the path
            iLev1 = -1;                       // we are already below the first var level
            iLev2 = dd->perm[bVarsR->index];  // the level of the second var
        }
        else  // cube's pointer is NOT complemented
        {
            fVar1Pres = 0;                    // the first var is absent on the path
            if ( cuddT(bVars) == b1 )
            {
                iLev1 = -1;                             // we are already below the first var level 
                iLev2 = dd->perm[bVars->index];         // the level of the second var
            }
            else
            {
                assert( cuddT(cuddT(bVars)) == b1 );
                iLev1 = dd->perm[bVars->index];         // the level of the first var 
                iLev2 = dd->perm[cuddT(bVars)->index];  // the level of the second var
            }
        }

        // cofactor the function
        // the cofactors are needed only if we are above the second level
        if ( LevelF < iLev2 )
        {
            if ( bFR != bF ) // bFunc is complemented 
            {
                bF0 = Cudd_Not( cuddE(bFR) );
                bF1 = Cudd_Not( cuddT(bFR) );
            }
            else
            {
                bF0 = cuddE(bFR);
                bF1 = cuddT(bFR);
            }
        }
        else
            bF0 = bF1 = NULL;

        // consider five cases:
        // (1) F is above iLev1
        // (2) F is on the level iLev1
        // (3) F is between iLev1 and iLev2
        // (4) F is on the level iLev2
        // (5) F is below iLev2

        // (1) F is above iLev1
        if ( LevelF < iLev1 )
        {
            // the returned result cannot have the hash attribute
            // because we still did not reach the level of Var1;
            // the attribute never travels above the level of Var1
            bRes0 = extraBddCheckVarsSymmetric( dd, bF0, bVars );
//          assert( !Hash_IsComplement( bRes0 ) );
            assert( bRes0 != z0 );
            if ( bRes0 == b0 )
                bRes = b0;
            else
                bRes = extraBddCheckVarsSymmetric( dd, bF1, bVars );
//          assert( !Hash_IsComplement( bRes ) );
            assert( bRes != z0 );
        }
        // (2) F is on the level iLev1
        else if ( LevelF == iLev1 )
        {
            bRes0 = extraBddCheckVarsSymmetric( dd, bF0, Cudd_Not( cuddT(bVars) ) );
            if ( bRes0 == b0 )
                bRes = b0;
            else
            {
                bRes1 = extraBddCheckVarsSymmetric( dd, bF1, Cudd_Not( cuddT(bVars) ) );
                if ( bRes1 == b0 )
                    bRes = b0;
                else
                {
//                  if ( Hash_IsComplement( bRes0 ) || Hash_IsComplement( bRes1 ) )
                    if ( bRes0 == z0 || bRes1 == z0 )
                        bRes = b1;
                    else
                        bRes = b0;
                }
            }
        }
        // (3) F is between iLev1 and iLev2
        else if ( LevelF < iLev2 )
        {
            bRes0 = extraBddCheckVarsSymmetric( dd, bF0, bVars );
            if ( bRes0 == b0 )
                bRes = b0;
            else
            {
                bRes1 = extraBddCheckVarsSymmetric( dd, bF1, bVars );
                if ( bRes1 == b0 )
                    bRes = b0;
                else
                {
//                  if ( Hash_IsComplement( bRes0 ) || Hash_IsComplement( bRes1 ) )
//                      bRes = Hash_Not( b1 );
                    if ( bRes0 == z0 || bRes1 == z0 )
                        bRes = z0;
                    else
                        bRes = b1;
                }
            }
        }
        // (4) F is on the level iLev2
        else if ( LevelF == iLev2 )
        {
            // this is the only place where the hash attribute (Hash_Not) can be added 
            // to the result; it can be added only if the path came through the node
            // lebeled with Var1; therefore, the hash attribute cannot be returned
            // to the caller function
            if ( fVar1Pres )
//              bRes = Hash_Not( b1 );
                bRes = z0;
            else 
                bRes = b0;
        }
        // (5) F is below iLev2
        else // if ( LevelF > iLev2 )
        {
            // it is possible that the path goes through the node labeled by Var1
            // and still everything is okay; we do not label with Hash_Not here
            // because the path does not go through node labeled by Var2
            bRes = b1;
        }

        cuddCacheInsert2(dd, extraBddCheckVarsSymmetric, bF, bVars, bRes);
        return bRes;
    }
}